

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferSTL.cpp
# Opt level: O0

void __thiscall
adios2::format::BufferSTL::Reset(BufferSTL *this,bool resetAbsolutePosition,bool zeroInitialize)

{
  vector<char,_std::allocator<char>_> *pvVar1;
  iterator __value;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var2;
  byte in_DL;
  byte in_SIL;
  int *in_RDI;
  size_t pos;
  size_t s;
  size_t bufsize;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int *in_stack_ffffffffffffff98;
  unsigned_long in_stack_ffffffffffffffa0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_ffffffffffffffa8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> __first;
  
  in_RDI[0xc] = 0;
  in_RDI[0xd] = 0;
  if ((in_SIL & 1) != 0) {
    in_RDI[0xe] = 0;
    in_RDI[0xf] = 0;
  }
  if ((in_DL & 1) == 0) {
    pvVar1 = (vector<char,_std::allocator<char>_> *)
             std::vector<char,_std::allocator<char>_>::size
                       ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x10));
    _Var2._M_current = (char *)pvVar1;
    if ((vector<char,_std::allocator<char>_> *)0x3ff < pvVar1) {
      _Var2._M_current = (char *)(vector<char,_std::allocator<char>_> *)0x400;
    }
    std::vector<char,_std::allocator<char>_>::begin
              ((vector<char,_std::allocator<char>_> *)_Var2._M_current);
    std::
    fill_n<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,unsigned_long,int>
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if ((vector<char,_std::allocator<char>_> *)0x400 < pvVar1) {
      __first._M_current =
           &pvVar1[-0x2b].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8;
      if (__first._M_current < (undefined1 *)0x400) {
        __first._M_current = (char *)0x400;
      }
      __value = std::vector<char,_std::allocator<char>_>::begin(_Var2._M_current);
      _Var2 = std::next<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                        (_Var2,0xadc899);
      std::
      fill_n<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,unsigned_long,int>
                (__first,(unsigned_long)_Var2._M_current,(int *)__value._M_current);
    }
  }
  else {
    std::vector<char,_std::allocator<char>_>::begin(in_stack_ffffffffffffff78);
    std::vector<char,_std::allocator<char>_>::end(in_stack_ffffffffffffff78);
    _Var2._M_current._4_4_ = in_stack_ffffffffffffff94;
    _Var2._M_current._0_4_ = in_stack_ffffffffffffff90;
    std::fill<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,int>
              (_Var2,in_stack_ffffffffffffff88,in_RDI);
  }
  return;
}

Assistant:

void BufferSTL::Reset(const bool resetAbsolutePosition, const bool zeroInitialize)
{
    m_Position = 0;
    if (resetAbsolutePosition)
    {
        m_AbsolutePosition = 0;
    }
    if (zeroInitialize)
    {
        std::fill(m_Buffer.begin(), m_Buffer.end(), 0);
    }
    else
    {
        // just zero out the first and last 1kb
        const size_t bufsize = m_Buffer.size();
        size_t s = (bufsize < 1024 ? bufsize : 1024);
        std::fill_n(m_Buffer.begin(), s, 0);
        if (bufsize > 1024)
        {
            size_t pos = bufsize - 1024;
            if (pos < 1024)
            {
                pos = 1024;
            }
            s = bufsize - pos;
            std::fill_n(next(m_Buffer.begin(), pos), s, 0);
        }
    }
}